

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active.cc
# Opt level: O0

void output_and_account_example(vw *all,active *a,example *ec)

{
  float *pfVar1;
  size_t sVar2;
  long in_RDX;
  long *in_RDI;
  int f;
  size_t i;
  float ai;
  label_data *ld;
  float in_stack_000001ec;
  float in_stack_000001f0;
  int in_stack_000001f4;
  v_array<char> in_stack_00000200;
  example *ec_00;
  vw *all_00;
  undefined8 in_stack_ffffffffffffff70;
  active *in_stack_ffffffffffffff78;
  size_t sVar3;
  float local_7c;
  size_t local_50;
  
  pfVar1 = (float *)(in_RDX + 0x6828);
  shared_data::update((shared_data *)*in_RDI,(bool)(*(byte *)(in_RDX + 0x68c8) & 1),
                      *pfVar1 != 3.4028235e+38,*(float *)(in_RDX + 0x68b0),
                      *(float *)(in_RDX + 0x6870),*(size_t *)(in_RDX + 0x68a0));
  if (((*pfVar1 != 3.4028235e+38) || (NAN(*pfVar1))) && ((*(byte *)(in_RDX + 0x68c8) & 1) == 0)) {
    *(double *)(*in_RDI + 0x38) =
         (double)*pfVar1 * (double)*(float *)(in_RDX + 0x6870) + *(double *)(*in_RDI + 0x38);
  }
  if ((*pfVar1 != 3.4028235e+38) || (NAN(*pfVar1))) {
    local_7c = 0.0;
  }
  else {
    local_7c = *(float *)(in_RDX + 0x6870);
  }
  *(double *)(*in_RDI + 0x30) = (double)local_7c + *(double *)(*in_RDI + 0x30);
  if ((*pfVar1 == 3.4028235e+38) && (!NAN(*pfVar1))) {
    query_decision(in_stack_ffffffffffffff78,(float)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                   (float)in_stack_ffffffffffffff70);
  }
  ec_00 = *(example **)(in_RDX + 0x6878);
  all_00 = *(vw **)(in_RDX + 0x6880);
  (*(code *)in_RDI[0x6a7])(*(undefined4 *)(in_RDX + 0x68a8),0xbf800000,(int)in_RDI[0x6a6]);
  local_50 = 0;
  while (sVar3 = local_50, sVar2 = v_array<int>::size((v_array<int> *)(in_RDI + 0x6a2)),
        sVar3 < sVar2) {
    v_array<int>::operator[]((v_array<int> *)(in_RDI + 0x6a2),local_50);
    ec_00 = *(example **)(in_RDX + 0x6878);
    all_00 = *(vw **)(in_RDX + 0x6880);
    active_print_result(in_stack_000001f4,in_stack_000001f0,in_stack_000001ec,in_stack_00000200);
    local_50 = local_50 + 1;
  }
  print_update(all_00,ec_00);
  return;
}

Assistant:

void output_and_account_example(vw& all, active& a, example& ec)
{
  label_data& ld = ec.l.simple;

  all.sd->update(ec.test_only, ld.label != FLT_MAX, ec.loss, ec.weight, ec.num_features);
  if (ld.label != FLT_MAX && !ec.test_only)
    all.sd->weighted_labels += ((double)ld.label) * ec.weight;
  all.sd->weighted_unlabeled_examples += ld.label == FLT_MAX ? ec.weight : 0;

  float ai = -1;
  if (ld.label == FLT_MAX)
    ai = query_decision(a, ec.confidence, (float)all.sd->weighted_unlabeled_examples);

  all.print(all.raw_prediction, ec.partial_prediction, -1, ec.tag);
  for (size_t i = 0; i < all.final_prediction_sink.size(); i++)
  {
    int f = (int)all.final_prediction_sink[i];
    active_print_result(f, ec.pred.scalar, ai, ec.tag);
  }

  print_update(all, ec);
}